

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable.cpp
# Opt level: O3

void __thiscall hash_table::resize(hash_table *this,size_t sizeMb)

{
  undefined8 *puVar1;
  hash_cluster *phVar2;
  size_t sVar3;
  hash_cluster *phVar4;
  long lVar5;
  size_t sVar6;
  ulong uVar7;
  size_t __n;
  
  this->sz_mb = sizeMb;
  sVar6 = (sizeMb & 0xfffffffffff) << 0xe;
  this->cluster_count = sVar6;
  sVar3 = pow2(sVar6);
  sVar6 = 0x400;
  if (0x400 < sVar3) {
    sVar6 = sVar3;
  }
  this->cluster_count = sVar6;
  phVar4 = (this->entries)._M_t.
           super___uniq_ptr_impl<hash_cluster,_std::default_delete<hash_cluster[]>_>._M_t.
           super__Tuple_impl<0UL,_hash_cluster_*,_std::default_delete<hash_cluster[]>_>.
           super__Head_base<0UL,_hash_cluster_*,_false>._M_head_impl;
  if (phVar4 != (hash_cluster *)0x0) {
    (this->entries)._M_t.super___uniq_ptr_impl<hash_cluster,_std::default_delete<hash_cluster[]>_>.
    _M_t.super__Tuple_impl<0UL,_hash_cluster_*,_std::default_delete<hash_cluster[]>_>.
    super__Head_base<0UL,_hash_cluster_*,_false>._M_head_impl = (hash_cluster *)0x0;
    operator_delete__(phVar4);
    sVar6 = this->cluster_count;
  }
  __n = sVar6 << 6;
  uVar7 = 0xffffffffffffffff;
  if (sVar6 < 0x400000000000000) {
    uVar7 = __n;
  }
  phVar4 = (hash_cluster *)operator_new__(uVar7);
  if (sVar6 != 0) {
    lVar5 = 0;
    do {
      puVar1 = (undefined8 *)((long)(phVar4->cluster_entries + 3) + lVar5);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)(phVar4->cluster_entries + 2) + lVar5);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)(phVar4->cluster_entries + 1) + lVar5);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)&phVar4->cluster_entries[0].pkey + lVar5);
      *puVar1 = 0;
      puVar1[1] = 0;
      lVar5 = lVar5 + 0x40;
    } while (sVar6 * 0x40 != lVar5);
  }
  phVar2 = (this->entries)._M_t.
           super___uniq_ptr_impl<hash_cluster,_std::default_delete<hash_cluster[]>_>._M_t.
           super__Tuple_impl<0UL,_hash_cluster_*,_std::default_delete<hash_cluster[]>_>.
           super__Head_base<0UL,_hash_cluster_*,_false>._M_head_impl;
  (this->entries)._M_t.super___uniq_ptr_impl<hash_cluster,_std::default_delete<hash_cluster[]>_>.
  _M_t.super__Tuple_impl<0UL,_hash_cluster_*,_std::default_delete<hash_cluster[]>_>.
  super__Head_base<0UL,_hash_cluster_*,_false>._M_head_impl = phVar4;
  if (phVar2 != (hash_cluster *)0x0) {
    operator_delete__(phVar2);
    phVar4 = (this->entries)._M_t.
             super___uniq_ptr_impl<hash_cluster,_std::default_delete<hash_cluster[]>_>._M_t.
             super__Tuple_impl<0UL,_hash_cluster_*,_std::default_delete<hash_cluster[]>_>.
             super__Head_base<0UL,_hash_cluster_*,_false>._M_head_impl;
    __n = this->cluster_count << 6;
  }
  memset(phVar4,0,__n);
  return;
}

Assistant:

void hash_table::resize(size_t sizeMb) {
	sz_mb = sizeMb;
	cluster_count = 1024 * 1024 * sz_mb / sizeof(hash_cluster);
	cluster_count = pow2(cluster_count);
	if (cluster_count < 1024) 
		cluster_count = 1024;
	if (entries.get() != nullptr)
		entries.reset();

	entries = std::unique_ptr<hash_cluster[]>(new hash_cluster[cluster_count]());
	clear();
}